

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRRMeshLoader.cpp
# Opt level: O3

void __thiscall
Assimp::IRRMeshImporter::InternReadFile
          (IRRMeshImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  byte *pbVar1;
  aiColor4t<float> *paVar2;
  float *out;
  float *out_00;
  vector<char,_std::allocator<char>_> *pvVar3;
  char cVar4;
  _func_int **pp_Var5;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *pvVar6;
  pointer *ppaVar7;
  float fVar8;
  float fVar9;
  IOStream *pIVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  undefined4 extraout_var;
  IrrXMLReader *pIVar15;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Logger *pLVar16;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  aiMesh *paVar17;
  undefined4 extraout_var_04;
  ulong *puVar18;
  aiFace *paVar19;
  aiVector3D *paVar20;
  aiColor4D *paVar21;
  undefined4 extraout_var_05;
  void *pvVar22;
  char *pcVar23;
  aiMesh **ppaVar24;
  aiMaterial **__dest;
  aiNode *this_00;
  uint *puVar25;
  runtime_error *prVar26;
  long *plVar27;
  byte bVar28;
  aiFace *paVar29;
  long *plVar30;
  aiVector3D *paVar31;
  pointer __src;
  size_type __n;
  byte *c;
  aiVector3D *paVar32;
  pointer paVar33;
  aiVector3D *paVar34;
  aiVector3D *paVar35;
  uint uVar36;
  ulong uVar37;
  pointer ppaVar38;
  int iVar39;
  long lVar40;
  IrrlichtBase *this_01;
  float fVar41;
  undefined1 auVar42 [16];
  aiMesh *curMesh;
  aiMaterial *curMat;
  uint curMatFlags;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> curVertices;
  vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> materials;
  vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> curColors;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> meshes;
  int idx;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> curUV2s;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> curUVs;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> curBitangents;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> curTangents;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> curNormals;
  CIrrXML_IOStreamReader st;
  aiVector3t<float> local_218;
  aiMesh *local_208;
  aiMesh *local_200;
  aiMaterial *local_1f8;
  uint local_1ec;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> local_1e8;
  vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> local_1c8;
  vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> local_1a8;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> local_188;
  uint local_170;
  int local_16c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> local_148;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> local_128;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> local_108;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> local_e8;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> local_c8;
  IOStream *local_a8;
  ulong local_a0;
  CIrrXML_IOStreamReader local_98;
  aiVector3D *local_68;
  aiColor4D *local_60;
  aiVector3D *local_58;
  aiVector3D *local_50;
  aiMesh *local_48;
  aiVector3D *local_40;
  aiVector3D *local_38;
  
  pvVar3 = &local_98.data;
  local_98.super_IFileReadCallBack._vptr_IFileReadCallBack = (_func_int **)pvVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"rb","");
  iVar11 = (*pIOHandler->_vptr_IOSystem[4])
                     (pIOHandler,(pFile->_M_dataplus)._M_p,
                      local_98.super_IFileReadCallBack._vptr_IFileReadCallBack);
  local_a8 = (IOStream *)CONCAT44(extraout_var,iVar11);
  if ((vector<char,_std::allocator<char>_> *)
      local_98.super_IFileReadCallBack._vptr_IFileReadCallBack != pvVar3) {
    operator_delete(local_98.super_IFileReadCallBack._vptr_IFileReadCallBack,
                    (ulong)(local_98.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start + 1));
  }
  if (local_a8 == (IOStream *)0x0) {
    prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_168,"Failed to open IRRMESH file ",pFile);
    plVar27 = (long *)std::__cxx11::string::append((char *)&local_168);
    local_98.super_IFileReadCallBack._vptr_IFileReadCallBack = (_func_int **)*plVar27;
    plVar30 = plVar27 + 2;
    if (local_98.super_IFileReadCallBack._vptr_IFileReadCallBack == (_func_int **)plVar30) {
      local_98.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)*plVar30;
      local_98.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)plVar27[3];
      local_98.super_IFileReadCallBack._vptr_IFileReadCallBack = (_func_int **)pvVar3;
    }
    else {
      local_98.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)*plVar30;
    }
    local_98.stream = (IOStream *)plVar27[1];
    *plVar27 = (long)plVar30;
    plVar27[1] = 0;
    *(undefined1 *)(plVar27 + 2) = 0;
    std::runtime_error::runtime_error(prVar26,(string *)&local_98);
    *(undefined ***)prVar26 = &PTR__runtime_error_0080bf48;
    __cxa_throw(prVar26,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  CIrrXML_IOStreamReader::CIrrXML_IOStreamReader(&local_98,local_a8);
  pIVar15 = irr::io::createIrrXMLReader(&local_98.super_IFileReadCallBack);
  (this->super_IrrlichtBase).reader = pIVar15;
  local_1c8.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (aiMaterial **)0x0;
  local_1c8.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
  super__Vector_impl_data._M_start = (aiMaterial **)0x0;
  local_1c8.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (aiMaterial **)0x0;
  local_188.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (aiMesh **)0x0;
  local_188.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_188.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (aiMesh **)0x0;
  std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::reserve(&local_1c8,5);
  std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::reserve(&local_188,5);
  this_01 = &this->super_IrrlichtBase;
  local_1f8 = (aiMaterial *)0x0;
  local_200 = (aiMesh *)0x0;
  local_1ec = 0;
  local_1e8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (aiVector3t<float> *)0x0;
  local_1e8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (aiVector3t<float> *)0x0;
  local_1e8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (aiVector3t<float> *)0x0;
  local_c8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (aiVector3t<float> *)0x0;
  local_c8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (aiVector3t<float> *)0x0;
  local_c8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (aiVector3t<float> *)0x0;
  local_e8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (aiVector3t<float> *)0x0;
  local_e8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (aiVector3t<float> *)0x0;
  local_e8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (aiVector3t<float> *)0x0;
  local_108.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (aiVector3t<float> *)0x0;
  local_108.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (aiVector3t<float> *)0x0;
  local_108.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (aiVector3t<float> *)0x0;
  local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (aiColor4t<float> *)0x0;
  local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (aiColor4t<float> *)0x0;
  local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (aiColor4t<float> *)0x0;
  local_128.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (aiVector3t<float> *)0x0;
  local_128.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (aiVector3t<float> *)0x0;
  local_128.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (aiVector3t<float> *)0x0;
  local_148.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (aiVector3t<float> *)0x0;
  local_148.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (aiVector3t<float> *)0x0;
  local_148.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (aiVector3t<float> *)0x0;
  local_a0 = 0;
  iVar11 = 0;
LAB_0043d284:
  iVar39 = 0;
  iVar12 = iVar11;
LAB_0043d287:
  do {
    iVar11 = iVar12;
LAB_0043d28b:
    iVar12 = (*this_01->reader->_vptr_IIrrXMLReader[2])();
    if ((char)iVar12 == '\0') {
      if (local_1f8 != (aiMaterial *)0x0 || local_200 != (aiMesh *)0x0) {
        if (local_1f8 == (aiMaterial *)0x0 || local_200 == (aiMesh *)0x0) {
          pLVar16 = DefaultLogger::get();
          Logger::error(pLVar16,"IRRMESH: A buffer must contain a mesh and a material");
          releaseMaterial(&local_1f8);
          releaseMesh(&local_200);
        }
        else {
          if (local_1c8.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_1c8.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<aiMaterial*,std::allocator<aiMaterial*>>::
            _M_realloc_insert<aiMaterial*const&>
                      ((vector<aiMaterial*,std::allocator<aiMaterial*>> *)&local_1c8,
                       (iterator)
                       local_1c8.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                       _M_impl.super__Vector_impl_data._M_finish,&local_1f8);
          }
          else {
            *local_1c8.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
             super__Vector_impl_data._M_finish = local_1f8;
            local_1c8.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_1c8.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          if (local_188.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_188.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*const&>
                      ((vector<aiMesh*,std::allocator<aiMesh*>> *)&local_188,
                       (iterator)
                       local_188.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_200);
          }
          else {
            *local_188.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
             super__Vector_impl_data._M_finish = local_200;
            local_188.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_188.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
        }
      }
      ppaVar38 = local_1c8.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      __src = local_1c8.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
              super__Vector_impl_data._M_start;
      if (local_1c8.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
          super__Vector_impl_data._M_start ==
          local_1c8.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_168._M_dataplus._M_p = (pointer)((long)&local_168 + 0x10);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_168,"IRRMESH: Unable to read a mesh from this file","");
        std::runtime_error::runtime_error(prVar26,(string *)&local_168);
        *(undefined ***)prVar26 = &PTR__runtime_error_0080bf48;
        __cxa_throw(prVar26,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      uVar14 = (uint)((ulong)((long)local_188.
                                    super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                                    super__Vector_impl_data._M_finish -
                             (long)local_188.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3);
      pScene->mNumMeshes = uVar14;
      ppaVar24 = (aiMesh **)
                 operator_new__((long)local_188.
                                      super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                                      _M_impl.super__Vector_impl_data._M_finish -
                                (long)local_188.
                                      super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                                      _M_impl.super__Vector_impl_data._M_start & 0x7fffffff8);
      pScene->mMeshes = ppaVar24;
      if (uVar14 != 0) {
        uVar37 = 0;
        do {
          pScene->mMeshes[uVar37] =
               local_188.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
               super__Vector_impl_data._M_start[uVar37];
          pScene->mMeshes[uVar37]->mNumUVComponents[3] = 0;
          uVar37 = uVar37 + 1;
          __src = local_1c8.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
          ppaVar38 = local_1c8.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
        } while (uVar37 < pScene->mNumMeshes);
      }
      pScene->mNumMaterials = (uint)((ulong)((long)ppaVar38 - (long)__src) >> 3);
      uVar37 = (long)ppaVar38 - (long)__src & 0x7fffffff8;
      __dest = (aiMaterial **)operator_new__(uVar37);
      pScene->mMaterials = __dest;
      memcpy(__dest,__src,uVar37);
      this_00 = (aiNode *)operator_new(0x478);
      aiNode::aiNode(this_00);
      pScene->mRootNode = this_00;
      (this_00->mName).length = 9;
      builtin_strncpy((this_00->mName).data,"<IRRMesh>",10);
      uVar14 = pScene->mNumMeshes;
      this_00->mNumMeshes = uVar14;
      puVar25 = (uint *)operator_new__((ulong)uVar14 << 2);
      pIVar10 = local_a8;
      this_00->mMeshes = puVar25;
      if (uVar14 != 0) {
        uVar37 = 0;
        do {
          pScene->mRootNode->mMeshes[uVar37] = (uint)uVar37;
          uVar37 = uVar37 + 1;
        } while (uVar37 < pScene->mNumMeshes);
      }
      if (this_01->reader != (IrrXMLReader *)0x0) {
        (*this_01->reader->_vptr_IIrrXMLReader[1])();
      }
      this_01->reader = (IrrXMLReader *)0x0;
      if (local_148.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (aiVector3t<float> *)0x0) {
        operator_delete(local_148.
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_148.
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_148.
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_128.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (aiVector3t<float> *)0x0) {
        operator_delete(local_128.
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_128.
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_128.
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl
          .super__Vector_impl_data._M_start != (aiColor4t<float> *)0x0) {
        operator_delete(local_1a8.
                        super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_1a8.
                              super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_1a8.
                              super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_108.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (aiVector3t<float> *)0x0) {
        operator_delete(local_108.
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_108.
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_108.
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_e8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (aiVector3t<float> *)0x0) {
        operator_delete(local_e8.
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_e8.
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_e8.
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_c8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (aiVector3t<float> *)0x0) {
        operator_delete(local_c8.
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_c8.
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_c8.
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_1e8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (aiVector3t<float> *)0x0) {
        operator_delete(local_1e8.
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_1e8.
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_1e8.
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_188.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_188.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_188.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_188.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_1c8.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
          super__Vector_impl_data._M_start != (aiMaterial **)0x0) {
        operator_delete(local_1c8.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_1c8.
                              super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_1c8.
                              super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      local_98.super_IFileReadCallBack._vptr_IFileReadCallBack =
           (_func_int **)&PTR__CIrrXML_IOStreamReader_0080e338;
      if (local_98.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_98.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_98.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_98.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      (*pIVar10->_vptr_IOStream[1])(pIVar10);
      return;
    }
    iVar13 = (*this_01->reader->_vptr_IIrrXMLReader[3])();
    iVar12 = iVar11;
    if (iVar13 != 1) {
      if (iVar13 != 3) goto LAB_0043d287;
      iVar13 = (*this_01->reader->_vptr_IIrrXMLReader[0xe])();
      c = (byte *)CONCAT44(extraout_var_04,iVar13);
      if (iVar39 != 2) {
        if (iVar39 != 1) goto LAB_0043d287;
        goto LAB_0043df1d;
      }
      local_208 = (aiMesh *)local_200->mFaces;
      local_48 = (aiMesh *)(local_208->mColors + (ulong)local_200->mNumFaces * 2 + -6);
      local_50 = local_200->mVertices;
      paVar20 = local_200->mNormals;
      paVar34 = local_200->mTangents;
      paVar32 = local_200->mBitangents;
      paVar21 = local_200->mColors[0];
      paVar35 = local_200->mTextureCoords[0];
      paVar31 = local_200->mTextureCoords[1];
      uVar14 = 0;
      local_16c = 0;
      break;
    }
    iVar13 = (*this_01->reader->_vptr_IIrrXMLReader[0xd])();
    if ((char *)CONCAT44(extraout_var_00,iVar13) == (char *)0x0) {
LAB_0043e7e9:
      __assert_fail("__null != s1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/include/assimp/StringComparison.h"
                    ,0x8f,"int Assimp::ASSIMP_stricmp(const char *, const char *)");
    }
    iVar13 = strcasecmp((char *)CONCAT44(extraout_var_00,iVar13),"buffer");
    if ((iVar13 == 0) && (local_1f8 != (aiMaterial *)0x0 || local_200 != (aiMesh *)0x0)) {
      if (local_1f8 == (aiMaterial *)0x0 || local_200 == (aiMesh *)0x0) {
        pLVar16 = DefaultLogger::get();
        Logger::error(pLVar16,"IRRMESH: A buffer must contain a mesh and a material");
        releaseMaterial(&local_1f8);
        releaseMesh(&local_200);
      }
      else {
        if (local_1c8.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_1c8.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<aiMaterial*,std::allocator<aiMaterial*>>::_M_realloc_insert<aiMaterial*const&>
                    ((vector<aiMaterial*,std::allocator<aiMaterial*>> *)&local_1c8,
                     (iterator)
                     local_1c8.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish,&local_1f8);
        }
        else {
          *local_1c8.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
           super__Vector_impl_data._M_finish = local_1f8;
          local_1c8.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_1c8.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        if (local_188.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_188.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*const&>
                    ((vector<aiMesh*,std::allocator<aiMesh*>> *)&local_188,
                     (iterator)
                     local_188.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_200);
        }
        else {
          *local_188.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
           super__Vector_impl_data._M_finish = local_200;
          local_188.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_188.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
      }
      local_1f8 = (aiMaterial *)0x0;
      local_200 = (aiMesh *)0x0;
      if (local_1e8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          local_1e8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        local_1e8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
        .super__Vector_impl_data._M_finish =
             local_1e8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
      }
      if (local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl
          .super__Vector_impl_data._M_finish !=
          local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl
          .super__Vector_impl_data._M_start) {
        local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
      }
      if (local_c8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          local_c8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        local_c8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_c8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
      }
      if (local_148.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          local_148.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        local_148.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
        .super__Vector_impl_data._M_finish =
             local_148.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
      }
      if (local_128.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          local_128.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        local_128.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
        .super__Vector_impl_data._M_finish =
             local_128.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
      }
      if (local_e8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          local_e8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        local_e8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_e8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
      }
      if (local_108.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          local_108.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        local_108.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
        .super__Vector_impl_data._M_finish =
             local_108.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
      }
    }
    iVar13 = (*this_01->reader->_vptr_IIrrXMLReader[0xd])();
    if ((char *)CONCAT44(extraout_var_01,iVar13) == (char *)0x0) goto LAB_0043e7e9;
    iVar13 = strcasecmp((char *)CONCAT44(extraout_var_01,iVar13),"material");
    if (iVar13 == 0) {
      if (local_1f8 != (aiMaterial *)0x0) {
        pLVar16 = DefaultLogger::get();
        Logger::warn(pLVar16,"IRRMESH: Only one material description per buffer, please");
        releaseMaterial(&local_1f8);
      }
      local_1f8 = IrrlichtBase::ParseMaterial(this_01,&local_1ec);
    }
    iVar13 = (*this_01->reader->_vptr_IIrrXMLReader[0xd])();
    if ((char *)CONCAT44(extraout_var_02,iVar13) == (char *)0x0) goto LAB_0043e7e9;
    iVar13 = strcasecmp((char *)CONCAT44(extraout_var_02,iVar13),"vertices");
    pp_Var5 = this_01->reader->_vptr_IIrrXMLReader;
    if (iVar13 == 0) {
      iVar12 = (*pp_Var5[9])(this_01->reader,"vertexCount");
      if (iVar12 != 0) goto LAB_0043da3a;
      pLVar16 = DefaultLogger::get();
      Logger::warn(pLVar16,"IRRMESH: Found mesh with zero vertices");
      releaseMaterial(&local_1f8);
      releaseMesh(&local_200);
      iVar39 = 0;
      goto LAB_0043d28b;
    }
    iVar13 = (*pp_Var5[0xd])();
    if ((char *)CONCAT44(extraout_var_03,iVar13) == (char *)0x0) goto LAB_0043e7e9;
    iVar13 = strcasecmp((char *)CONCAT44(extraout_var_03,iVar13),"indices");
    if (iVar13 != 0) goto LAB_0043d287;
    if ((local_1e8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
         _M_impl.super__Vector_impl_data._M_start ==
         local_1e8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
         _M_impl.super__Vector_impl_data._M_finish) && (local_1f8 != (aiMaterial *)0x0)) {
      releaseMaterial(&local_1f8);
      prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_168._M_dataplus._M_p = (pointer)((long)&local_168 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_168,"IRRMESH: indices must come after vertices","");
      std::runtime_error::runtime_error(prVar26,(string *)&local_168);
      *(undefined ***)prVar26 = &PTR__runtime_error_0080bf48;
      __cxa_throw(prVar26,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    paVar17 = (aiMesh *)operator_new(0x520);
    paVar17->mPrimitiveTypes = 0;
    paVar17->mNumVertices = 0;
    paVar17->mNumFaces = 0;
    memset(&paVar17->mVertices,0,0xcc);
    paVar17->mBones = (aiBone **)0x0;
    paVar17->mMaterialIndex = 0;
    (paVar17->mName).length = 0;
    (paVar17->mName).data[0] = '\0';
    memset((paVar17->mName).data + 1,0x1b,0x3ff);
    paVar17->mNumAnimMeshes = 0;
    paVar17->mAnimMeshes = (aiAnimMesh **)0x0;
    paVar17->mMethod = 0;
    (paVar17->mAABB).mMin.x = 0.0;
    (paVar17->mAABB).mMin.y = 0.0;
    (paVar17->mAABB).mMin.z = 0.0;
    (paVar17->mAABB).mMax.x = 0.0;
    (paVar17->mAABB).mMax.y = 0.0;
    (paVar17->mAABB).mMax.z = 0.0;
    memset(paVar17->mColors,0,0xa0);
    local_200 = paVar17;
    uVar14 = (*this_01->reader->_vptr_IIrrXMLReader[9])();
    local_200->mNumVertices = uVar14;
    uVar14 = local_200->mNumVertices;
    if (uVar14 == 0) {
      pLVar16 = DefaultLogger::get();
      Logger::warn(pLVar16,"IRRMESH: Found mesh with zero indices");
      releaseMesh(&local_200);
      releaseMaterial(&local_1f8);
      iVar39 = 0;
      goto LAB_0043d28b;
    }
    if (0x55555555 < uVar14 * -0x55555555) {
      pLVar16 = DefaultLogger::get();
      Logger::warn(pLVar16,"IRRMESH: Number if indices isn\'t divisible by 3");
      uVar14 = local_200->mNumVertices;
    }
    paVar17 = local_200;
    uVar37 = (ulong)uVar14 / 3;
    local_200->mNumFaces = uVar14 / 3;
    puVar18 = (ulong *)operator_new__(uVar37 * 0x10 + 8);
    *puVar18 = uVar37;
    paVar19 = (aiFace *)(puVar18 + 1);
    if (2 < uVar14) {
      paVar29 = paVar19;
      do {
        paVar29->mNumIndices = 0;
        paVar29->mIndices = (uint *)0x0;
        paVar29 = paVar29 + 1;
      } while (paVar29 != paVar19 + uVar37);
    }
    paVar17->mFaces = paVar19;
    paVar17->mMaterialIndex =
         (uint)((ulong)((long)local_1c8.
                              super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_1c8.
                             super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl
                             .super__Vector_impl_data._M_start) >> 3);
    paVar17->mPrimitiveTypes = 4;
    local_208 = local_200;
    uVar14 = local_200->mNumVertices;
    uVar37 = (ulong)uVar14 * 0xc;
    paVar20 = (aiVector3D *)operator_new__(uVar37);
    if (uVar14 != 0) {
      memset(paVar20,0,((uVar37 - 0xc) / 0xc) * 0xc + 0xc);
    }
    local_208->mVertices = paVar20;
    lVar40 = (long)local_1e8.
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_1e8.
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start;
    if ((long)local_c8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_c8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_start == lVar40) {
      uVar14 = local_208->mNumVertices;
      uVar37 = (ulong)uVar14 * 0xc;
      paVar20 = (aiVector3D *)operator_new__(uVar37);
      if (uVar14 != 0) {
        memset(paVar20,0,((uVar37 - 0xc) / 0xc) * 0xc + 0xc);
      }
      local_208->mNormals = paVar20;
    }
    if ((long)local_e8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_e8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_start == lVar40) {
      uVar14 = local_208->mNumVertices;
      uVar37 = (ulong)uVar14 * 0xc;
      paVar20 = (aiVector3D *)operator_new__(uVar37);
      if (uVar14 != 0) {
        memset(paVar20,0,((uVar37 - 0xc) / 0xc) * 0xc + 0xc);
      }
      local_208->mTangents = paVar20;
    }
    if ((long)local_108.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_108.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_start == lVar40) {
      uVar14 = local_208->mNumVertices;
      uVar37 = (ulong)uVar14 * 0xc;
      paVar20 = (aiVector3D *)operator_new__(uVar37);
      if (uVar14 != 0) {
        memset(paVar20,0,((uVar37 - 0xc) / 0xc) * 0xc + 0xc);
      }
      local_208->mBitangents = paVar20;
    }
    if (((long)local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
               _M_impl.super__Vector_impl_data._M_finish -
         (long)local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
               _M_impl.super__Vector_impl_data._M_start >> 4 == (lVar40 >> 2) * -0x5555555555555555)
       && ((local_a0 & 1) != 0)) {
      uVar14 = local_208->mNumVertices;
      uVar37 = (ulong)uVar14 << 4;
      paVar21 = (aiColor4D *)operator_new__(uVar37);
      if (uVar14 != 0) {
        memset(paVar21,0,uVar37);
      }
      local_208->mColors[0] = paVar21;
    }
    if ((long)local_128.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_128.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_start == lVar40) {
      uVar14 = local_208->mNumVertices;
      uVar37 = (ulong)uVar14 * 0xc;
      paVar20 = (aiVector3D *)operator_new__(uVar37);
      if (uVar14 != 0) {
        memset(paVar20,0,((uVar37 - 0xc) / 0xc) * 0xc + 0xc);
      }
      local_208->mTextureCoords[0] = paVar20;
    }
    iVar39 = 2;
    if ((long)local_148.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_148.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_start == lVar40) {
      uVar14 = local_208->mNumVertices;
      uVar37 = (ulong)uVar14 * 0xc;
      paVar20 = (aiVector3D *)operator_new__(uVar37);
      if (uVar14 != 0) {
        memset(paVar20,0,((uVar37 - 0xc) / 0xc) * 0xc + 0xc);
      }
      local_208->mTextureCoords[1] = paVar20;
    }
  } while( true );
LAB_0043db62:
  paVar17 = local_208;
  uVar37 = (ulong)*c;
  if (uVar37 < 0x21) {
    if ((0x100002600U >> (uVar37 & 0x3f) & 1) == 0) {
      if (uVar37 != 0) goto LAB_0043db8a;
      goto LAB_0043de9f;
    }
    c = c + 1;
    goto LAB_0043db62;
  }
LAB_0043db8a:
  if (local_208 < local_48) {
    local_170 = uVar14;
    local_68 = paVar35;
    local_60 = paVar21;
    local_58 = paVar32;
    local_40 = paVar31;
    local_38 = paVar34;
    if (uVar14 == 0) {
      local_208->mPrimitiveTypes = 3;
      pvVar22 = operator_new__(0xc);
      *(void **)&paVar17->mNumFaces = pvVar22;
      uVar37 = (ulong)*c;
    }
    uVar14 = 0;
    if (0xf5 < (byte)((char)uVar37 - 0x3aU)) {
      uVar14 = 0;
      do {
        uVar14 = (uint)(byte)((char)uVar37 - 0x30) + uVar14 * 10;
        pbVar1 = c + 1;
        uVar37 = (ulong)*pbVar1;
        c = c + 1;
      } while (0xf5 < (byte)(*pbVar1 - 0x3a));
    }
    uVar37 = ((long)local_1e8.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_1e8.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
    if (uVar37 < uVar14 || uVar37 - uVar14 == 0) {
      pLVar16 = DefaultLogger::get();
      uVar14 = 0;
      Logger::error(pLVar16,"IRRMESH: Index out of range");
    }
    *(int *)(*(long *)&local_208->mNumFaces + (ulong)local_170 * 4) = local_16c;
    local_50->z = local_1e8.
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_start[uVar14].z;
    fVar41 = local_1e8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar14].y;
    local_50->x = local_1e8.
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_start[uVar14].x;
    local_50->y = fVar41;
    if (paVar20 == (aiVector3D *)0x0) {
      paVar20 = (aiVector3D *)0x0;
    }
    else {
      paVar20->z = local_c8.
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar14].z;
      fVar41 = local_c8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar14].y;
      paVar20->x = local_c8.
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar14].x;
      paVar20->y = fVar41;
      paVar20 = paVar20 + 1;
    }
    if (local_38 == (aiVector3D *)0x0) {
      paVar34 = (aiVector3D *)0x0;
    }
    else {
      local_38->z = local_e8.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar14].z;
      fVar41 = local_e8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar14].y;
      local_38->x = local_e8.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar14].x;
      local_38->y = fVar41;
      paVar34 = local_38 + 1;
    }
    if (local_58 == (aiVector3D *)0x0) {
      paVar32 = (aiVector3D *)0x0;
    }
    else {
      local_58->z = local_108.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar14].z;
      fVar41 = local_108.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar14].y;
      local_58->x = local_108.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar14].x;
      local_58->y = fVar41;
      paVar32 = local_58 + 1;
    }
    if (local_60 == (aiColor4D *)0x0) {
      paVar21 = (aiColor4D *)0x0;
    }
    else {
      paVar2 = local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
               _M_impl.super__Vector_impl_data._M_start + uVar14;
      fVar41 = paVar2->g;
      fVar8 = paVar2->b;
      fVar9 = paVar2->a;
      local_60->r = paVar2->r;
      local_60->g = fVar41;
      local_60->b = fVar8;
      local_60->a = fVar9;
      paVar21 = local_60 + 1;
    }
    if (local_68 == (aiVector3D *)0x0) {
      paVar35 = (aiVector3D *)0x0;
    }
    else {
      local_68->z = local_128.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar14].z;
      fVar41 = local_128.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar14].y;
      local_68->x = local_128.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar14].x;
      local_68->y = fVar41;
      paVar35 = local_68 + 1;
    }
    if (local_40 == (aiVector3D *)0x0) {
      paVar31 = (aiVector3D *)0x0;
    }
    else {
      local_40->z = local_148.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar14].z;
      fVar41 = local_148.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar14].y;
      local_40->x = local_148.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar14].x;
      local_40->y = fVar41;
      paVar31 = local_40 + 1;
    }
    local_16c = local_16c + 1;
    local_50 = local_50 + 1;
    uVar36 = local_170 + 1;
    uVar14 = uVar36;
    if (uVar36 == 3) {
      uVar14 = 0;
    }
    local_208 = (aiMesh *)(local_208->mColors + (ulong)(uVar36 == 3) * 2 + -6);
    goto LAB_0043db62;
  }
  pLVar16 = DefaultLogger::get();
  Logger::error(pLVar16,"IRRMESH: Too many indices");
LAB_0043de9f:
  if (local_208 != local_48) {
    pLVar16 = DefaultLogger::get();
    Logger::error(pLVar16,"IRRMESH: Not enough indices");
  }
  iVar39 = 0;
  if (((local_1ec & 1) != 0) && ((local_a0 & 1) == 0)) {
    iVar39 = 0;
    aiMaterial::AddBinaryProperty
              (local_1f8,
               &(local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                 _M_impl.super__Vector_impl_data._M_start)->a,4,"$mat.opacity",0,0,aiPTI_Float);
  }
  goto LAB_0043d287;
LAB_0043df1d:
  out = &local_218.y;
  out_00 = &local_218.z;
  while (((ulong)*c < 0x21 && ((0x100002600U >> ((ulong)*c & 0x3f) & 1) != 0))) {
    c = c + 1;
  }
  local_218.x = 0.0;
  local_218.y = 0.0;
  local_218.z = 0.0;
  local_168._0_16_ = ZEXT816(0);
  for (pcVar23 = fast_atoreal_move<float>((char *)c,&local_218.x,true);
      (*pcVar23 == ' ' || (*pcVar23 == '\t')); pcVar23 = pcVar23 + 1) {
  }
  for (pcVar23 = fast_atoreal_move<float>(pcVar23,out,true); (*pcVar23 == ' ' || (*pcVar23 == '\t'))
      ; pcVar23 = pcVar23 + 1) {
  }
  for (pcVar23 = fast_atoreal_move<float>(pcVar23,out_00,true);
      (*pcVar23 == ' ' || (*pcVar23 == '\t')); pcVar23 = pcVar23 + 1) {
  }
  if (local_1e8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_1e8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)&local_1e8,
               (iterator)
               local_1e8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
               _M_impl.super__Vector_impl_data._M_finish,&local_218);
  }
  else {
    (local_1e8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
     super__Vector_impl_data._M_finish)->z = local_218.z;
    (local_1e8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
     super__Vector_impl_data._M_finish)->x = local_218.x;
    (local_1e8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
     super__Vector_impl_data._M_finish)->y = local_218.y;
    local_1e8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_1e8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
         _M_impl.super__Vector_impl_data._M_finish + 1;
  }
  for (pcVar23 = fast_atoreal_move<float>(pcVar23,&local_218.x,true);
      (*pcVar23 == ' ' || (*pcVar23 == '\t')); pcVar23 = pcVar23 + 1) {
  }
  for (pcVar23 = fast_atoreal_move<float>(pcVar23,out,true); (*pcVar23 == ' ' || (*pcVar23 == '\t'))
      ; pcVar23 = pcVar23 + 1) {
  }
  for (pcVar23 = fast_atoreal_move<float>(pcVar23,out_00,true);
      (*pcVar23 == ' ' || (*pcVar23 == '\t')); pcVar23 = pcVar23 + 1) {
  }
  if (local_c8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_c8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)&local_c8,
               (iterator)
               local_c8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
               _M_impl.super__Vector_impl_data._M_finish,&local_218);
  }
  else {
    (local_c8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
     super__Vector_impl_data._M_finish)->z = local_218.z;
    (local_c8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
     super__Vector_impl_data._M_finish)->x = local_218.x;
    (local_c8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
     super__Vector_impl_data._M_finish)->y = local_218.y;
    local_c8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_c8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
         .super__Vector_impl_data._M_finish + 1;
  }
  uVar14 = 0;
  do {
    cVar4 = *pcVar23;
    if ((byte)(cVar4 - 0x30U) < 10) {
      uVar14 = uVar14 << 4 | (uint)(byte)(cVar4 - 0x30U);
    }
    else {
      bVar28 = cVar4 + 0xbf;
      if ((5 < bVar28) && (bVar28 = cVar4 + 0x9f, 5 < bVar28)) break;
      uVar14 = uVar14 * 0x10 + (uint)bVar28 + 10;
    }
    pcVar23 = pcVar23 + 1;
  } while( true );
  auVar42._0_4_ = (float)(uVar14 >> 0x10 & 0xff);
  auVar42._4_4_ = (float)(uVar14 >> 8 & 0xff);
  auVar42._8_4_ = (float)(uVar14 & 0xff);
  auVar42._12_4_ = (float)(uVar14 >> 0x18);
  local_168._0_16_ = divps(auVar42,_DAT_006c34a0);
  if (local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    if ((local_168._M_dataplus._M_p._0_4_ ==
         local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
         super__Vector_impl_data._M_finish[-1].r) &&
       (!NAN(local_168._M_dataplus._M_p._0_4_) &&
        !NAN(local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_finish[-1].r))) {
      if ((local_168._M_dataplus._M_p._4_4_ ==
           local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
           _M_impl.super__Vector_impl_data._M_finish[-1].g) &&
         (!NAN(local_168._M_dataplus._M_p._4_4_) &&
          !NAN(local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
               _M_impl.super__Vector_impl_data._M_finish[-1].g))) {
        if (((float)local_168._M_string_length ==
             local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_finish[-1].b) &&
           (!NAN((float)local_168._M_string_length) &&
            !NAN(local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish[-1].b))) {
          if ((local_168._M_string_length._4_4_ ==
               local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
               _M_impl.super__Vector_impl_data._M_finish[-1].a) &&
             (!NAN(local_168._M_string_length._4_4_) &&
              !NAN(local_1a8.
                   super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
                   super__Vector_impl_data._M_finish[-1].a))) goto LAB_0043e17f;
        }
      }
    }
    local_a0 = CONCAT71((uint7)(ushort)(uVar14 >> 0x10),1);
  }
LAB_0043e17f:
  if (local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiColor4t<float>,std::allocator<aiColor4t<float>>>::
    _M_realloc_insert<aiColor4t<float>const&>
              ((vector<aiColor4t<float>,std::allocator<aiColor4t<float>>> *)&local_1a8,
               (iterator)
               local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
               _M_impl.super__Vector_impl_data._M_finish,(aiColor4t<float> *)&local_168);
  }
  else {
    *(pointer *)
     local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
     super__Vector_impl_data._M_finish = local_168._M_dataplus._M_p;
    (local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
     super__Vector_impl_data._M_finish)->b = (float)(undefined4)local_168._M_string_length;
    (local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
     super__Vector_impl_data._M_finish)->a = (float)local_168._M_string_length._4_4_;
    local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  for (; (*pcVar23 == ' ' || (*pcVar23 == '\t')); pcVar23 = pcVar23 + 1) {
  }
  for (pcVar23 = fast_atoreal_move<float>(pcVar23,&local_218.x,true);
      (*pcVar23 == ' ' || (*pcVar23 == '\t')); pcVar23 = pcVar23 + 1) {
  }
  for (c = (byte *)fast_atoreal_move<float>(pcVar23,out,true); (*c == 0x20 || (*c == 9)); c = c + 1)
  {
  }
  local_218.z = 0.0;
  fVar41 = 1.0 - local_218.y;
  local_218.y = fVar41;
  if (local_128.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_128.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)&local_128,
               (iterator)
               local_128.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
               _M_impl.super__Vector_impl_data._M_finish,&local_218);
  }
  else {
    (local_128.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
     super__Vector_impl_data._M_finish)->z = 0.0;
    (local_128.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
     super__Vector_impl_data._M_finish)->x = local_218.x;
    (local_128.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
     super__Vector_impl_data._M_finish)->y = fVar41;
    local_128.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_128.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
         _M_impl.super__Vector_impl_data._M_finish + 1;
  }
  if (iVar11 == 1) {
    for (pcVar23 = fast_atoreal_move<float>((char *)c,&local_218.x,true);
        (*pcVar23 == ' ' || (*pcVar23 == '\t')); pcVar23 = pcVar23 + 1) {
    }
    c = (byte *)fast_atoreal_move<float>(pcVar23,out,true);
    local_218.y = 1.0 - local_218.y;
    if (local_148.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
        .super__Vector_impl_data._M_finish ==
        local_148.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)&local_148,
                 (iterator)
                 local_148.
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_finish,&local_218);
      goto LAB_0043e47f;
    }
    pvVar6 = &local_148;
    paVar33 = local_148.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    if (iVar11 != 2) goto LAB_0043e47f;
    for (pcVar23 = fast_atoreal_move<float>((char *)c,&local_218.x,true);
        (*pcVar23 == ' ' || (*pcVar23 == '\t')); pcVar23 = pcVar23 + 1) {
    }
    for (pcVar23 = fast_atoreal_move<float>(pcVar23,out_00,true);
        (*pcVar23 == ' ' || (*pcVar23 == '\t')); pcVar23 = pcVar23 + 1) {
    }
    for (pcVar23 = fast_atoreal_move<float>(pcVar23,out,true);
        (*pcVar23 == ' ' || (*pcVar23 == '\t')); pcVar23 = pcVar23 + 1) {
    }
    local_218._0_8_ = local_218._0_8_ ^ 0x8000000000000000;
    if (local_e8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_e8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)&local_e8,
                 (iterator)
                 local_e8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,&local_218);
    }
    else {
      (local_e8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
       super__Vector_impl_data._M_finish)->z = local_218.z;
      (local_e8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
       super__Vector_impl_data._M_finish)->x = local_218.x;
      (local_e8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
       super__Vector_impl_data._M_finish)->y = local_218.y;
      local_e8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_e8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    for (pcVar23 = fast_atoreal_move<float>(pcVar23,&local_218.x,true);
        (*pcVar23 == ' ' || (*pcVar23 == '\t')); pcVar23 = pcVar23 + 1) {
    }
    for (pcVar23 = fast_atoreal_move<float>(pcVar23,out_00,true);
        (*pcVar23 == ' ' || (*pcVar23 == '\t')); pcVar23 = pcVar23 + 1) {
    }
    for (c = (byte *)fast_atoreal_move<float>(pcVar23,out,true); (*c == 0x20 || (*c == 9));
        c = c + 1) {
    }
    local_218._0_8_ = local_218._0_8_ ^ 0x8000000000000000;
    if (local_108.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
        .super__Vector_impl_data._M_finish ==
        local_108.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)&local_108,
                 (iterator)
                 local_108.
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_finish,&local_218);
      goto LAB_0043e47f;
    }
    pvVar6 = &local_108;
    paVar33 = local_108.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  }
  ppaVar7 = &(pvVar6->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
             _M_impl.super__Vector_impl_data._M_finish;
  paVar33->z = local_218.z;
  paVar33->x = local_218.x;
  paVar33->y = local_218.y;
  *ppaVar7 = *ppaVar7 + 1;
LAB_0043e47f:
  while( true ) {
    bVar28 = *c;
    if ((bVar28 < 0xe) && ((0x2401U >> (bVar28 & 0x1f) & 1) != 0)) break;
    c = c + 1;
  }
  while ((bVar28 == 10 || (bVar28 == 0xd))) {
    pbVar1 = c + 1;
    c = c + 1;
    bVar28 = *pbVar1;
  }
  if (bVar28 == 0) goto LAB_0043d284;
  goto LAB_0043df1d;
LAB_0043da3a:
  __n = (size_type)iVar12;
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve(&local_1e8,__n);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve(&local_c8,__n);
  std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::reserve(&local_1a8,__n);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve(&local_128,__n);
  iVar12 = (*this_01->reader->_vptr_IIrrXMLReader[8])(this_01->reader,"type");
  pcVar23 = (char *)CONCAT44(extraout_var_05,iVar12);
  if (pcVar23 == (char *)0x0) {
    __assert_fail("__null != s2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/include/assimp/StringComparison.h"
                  ,0x90,"int Assimp::ASSIMP_stricmp(const char *, const char *)");
  }
  iVar12 = strcasecmp("2tcoords",pcVar23);
  if (iVar12 != 0) {
    iVar12 = strcasecmp("tangents",pcVar23);
    if (iVar12 == 0) {
      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve(&local_e8,__n);
      iVar39 = 1;
      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve(&local_108,__n);
      iVar12 = 2;
    }
    else {
      iVar13 = strcasecmp("standard",pcVar23);
      iVar39 = 1;
      iVar12 = 0;
      if (iVar13 != 0) {
        releaseMaterial(&local_1f8);
        pLVar16 = DefaultLogger::get();
        Logger::warn(pLVar16,"IRRMESH: Unknown vertex format");
        iVar12 = iVar11;
      }
    }
    goto LAB_0043d287;
  }
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve(&local_148,__n);
  iVar39 = 1;
  iVar12 = 1;
  if ((local_1ec >> 0x14 & 1) == 0) goto LAB_0043d287;
  local_168._M_dataplus._M_p._0_4_ = 1.4013e-45;
  uVar36 = 0;
  uVar14 = 10;
  if (((local_1ec & 2) == 0) && (uVar14 = 6, (local_1ec >> 8 & 1) == 0)) {
    uVar14 = 1;
    uVar36 = 1;
    if ((local_1ec >> 0x10 & 1) == 0) goto LAB_0043de50;
  }
  aiMaterial::AddBinaryProperty(local_1f8,&local_168,4,"$tex.uvwsrc",uVar14,uVar36,aiPTI_Integer);
LAB_0043de50:
  iVar39 = 1;
  goto LAB_0043d287;
}

Assistant:

void IRRMeshImporter::InternReadFile( const std::string& pFile,
    aiScene* pScene, IOSystem* pIOHandler)
{
    std::unique_ptr<IOStream> file( pIOHandler->Open( pFile));

    // Check whether we can read from the file
    if( file.get() == NULL)
        throw DeadlyImportError( "Failed to open IRRMESH file " + pFile + "");

    // Construct the irrXML parser
    CIrrXML_IOStreamReader st(file.get());
    reader = createIrrXMLReader((IFileReadCallBack*) &st);

    // final data
    std::vector<aiMaterial*> materials;
    std::vector<aiMesh*>     meshes;
    materials.reserve (5);
    meshes.reserve(5);

    // temporary data - current mesh buffer
    aiMaterial* curMat  = nullptr;
    aiMesh* curMesh     = nullptr;
    unsigned int curMatFlags = 0;

    std::vector<aiVector3D> curVertices,curNormals,curTangents,curBitangents;
    std::vector<aiColor4D>  curColors;
    std::vector<aiVector3D> curUVs,curUV2s;

    // some temporary variables
    int textMeaning = 0;
    int vertexFormat = 0; // 0 = normal; 1 = 2 tcoords, 2 = tangents
    bool useColors = false;

    // Parse the XML file
    while (reader->read())  {
        switch (reader->getNodeType())  {
        case EXN_ELEMENT:

            if (!ASSIMP_stricmp(reader->getNodeName(),"buffer") && (curMat || curMesh)) {
                // end of previous buffer. A material and a mesh should be there
                if ( !curMat || !curMesh)   {
                    ASSIMP_LOG_ERROR("IRRMESH: A buffer must contain a mesh and a material");
                    releaseMaterial( &curMat );
                    releaseMesh( &curMesh );
                } else {
                    materials.push_back(curMat);
                    meshes.push_back(curMesh);
                }
                curMat  = nullptr;
                curMesh = nullptr;

                curVertices.clear();
                curColors.clear();
                curNormals.clear();
                curUV2s.clear();
                curUVs.clear();
                curTangents.clear();
                curBitangents.clear();
            }


            if (!ASSIMP_stricmp(reader->getNodeName(),"material"))  {
                if (curMat) {
                    ASSIMP_LOG_WARN("IRRMESH: Only one material description per buffer, please");
                    releaseMaterial( &curMat );
                }
                curMat = ParseMaterial(curMatFlags);
            }
            /* no else here! */ if (!ASSIMP_stricmp(reader->getNodeName(),"vertices"))
            {
                int num = reader->getAttributeValueAsInt("vertexCount");

                if (!num)   {
                    // This is possible ... remove the mesh from the list and skip further reading
                    ASSIMP_LOG_WARN("IRRMESH: Found mesh with zero vertices");

                    releaseMaterial( &curMat );
                    releaseMesh( &curMesh );
                    textMeaning = 0;
                    continue;
                }

                curVertices.reserve(num);
                curNormals.reserve(num);
                curColors.reserve(num);
                curUVs.reserve(num);

                // Determine the file format
                const char* t = reader->getAttributeValueSafe("type");
                if (!ASSIMP_stricmp("2tcoords", t)) {
                    curUV2s.reserve (num);
                    vertexFormat = 1;

                    if (curMatFlags & AI_IRRMESH_EXTRA_2ND_TEXTURE) {
                        // *********************************************************
                        // We have a second texture! So use this UV channel
                        // for it. The 2nd texture can be either a normal
                        // texture (solid_2layer or lightmap_xxx) or a normal
                        // map (normal_..., parallax_...)
                        // *********************************************************
                        int idx = 1;
                        aiMaterial* mat = ( aiMaterial* ) curMat;

                        if (curMatFlags & AI_IRRMESH_MAT_lightmap){
                            mat->AddProperty(&idx,1,AI_MATKEY_UVWSRC_LIGHTMAP(0));
                        }
                        else if (curMatFlags & AI_IRRMESH_MAT_normalmap_solid){
                            mat->AddProperty(&idx,1,AI_MATKEY_UVWSRC_NORMALS(0));
                        }
                        else if (curMatFlags & AI_IRRMESH_MAT_solid_2layer) {
                            mat->AddProperty(&idx,1,AI_MATKEY_UVWSRC_DIFFUSE(1));
                        }
                    }
                }
                else if (!ASSIMP_stricmp("tangents", t))    {
                    curTangents.reserve (num);
                    curBitangents.reserve (num);
                    vertexFormat = 2;
                }
                else if (ASSIMP_stricmp("standard", t)) {
                    releaseMaterial( &curMat );
                    ASSIMP_LOG_WARN("IRRMESH: Unknown vertex format");
                }
                else vertexFormat = 0;
                textMeaning = 1;
            }
            else if (!ASSIMP_stricmp(reader->getNodeName(),"indices"))  {
                if (curVertices.empty() && curMat)  {
                    releaseMaterial( &curMat );
                    throw DeadlyImportError("IRRMESH: indices must come after vertices");
                }

                textMeaning = 2;

                // start a new mesh
                curMesh = new aiMesh();

                // allocate storage for all faces
                curMesh->mNumVertices = reader->getAttributeValueAsInt("indexCount");
                if (!curMesh->mNumVertices) {
                    // This is possible ... remove the mesh from the list and skip further reading
                    ASSIMP_LOG_WARN("IRRMESH: Found mesh with zero indices");

                    // mesh - away
                    releaseMesh( &curMesh );

                    // material - away
                    releaseMaterial( &curMat );

                    textMeaning = 0;
                    continue;
                }

                if (curMesh->mNumVertices % 3)  {
                    ASSIMP_LOG_WARN("IRRMESH: Number if indices isn't divisible by 3");
                }

                curMesh->mNumFaces = curMesh->mNumVertices / 3;
                curMesh->mFaces = new aiFace[curMesh->mNumFaces];

                // setup some members
                curMesh->mMaterialIndex = (unsigned int)materials.size();
                curMesh->mPrimitiveTypes = aiPrimitiveType_TRIANGLE;

                // allocate storage for all vertices
                curMesh->mVertices = new aiVector3D[curMesh->mNumVertices];

                if (curNormals.size() == curVertices.size())    {
                    curMesh->mNormals = new aiVector3D[curMesh->mNumVertices];
                }
                if (curTangents.size() == curVertices.size())   {
                    curMesh->mTangents = new aiVector3D[curMesh->mNumVertices];
                }
                if (curBitangents.size() == curVertices.size()) {
                    curMesh->mBitangents = new aiVector3D[curMesh->mNumVertices];
                }
                if (curColors.size() == curVertices.size() && useColors)    {
                    curMesh->mColors[0] = new aiColor4D[curMesh->mNumVertices];
                }
                if (curUVs.size() == curVertices.size())    {
                    curMesh->mTextureCoords[0] = new aiVector3D[curMesh->mNumVertices];
                }
                if (curUV2s.size() == curVertices.size())   {
                    curMesh->mTextureCoords[1] = new aiVector3D[curMesh->mNumVertices];
                }
            }
            break;

        case EXN_TEXT:
            {
            const char* sz = reader->getNodeData();
            if (textMeaning == 1)   {
                textMeaning = 0;

                // read vertices
                do  {
                    SkipSpacesAndLineEnd(&sz);
                    aiVector3D temp;aiColor4D c;

                    // Read the vertex position
                    sz = fast_atoreal_move<float>(sz,(float&)temp.x);
                    SkipSpaces(&sz);

                    sz = fast_atoreal_move<float>(sz,(float&)temp.y);
                    SkipSpaces(&sz);

                    sz = fast_atoreal_move<float>(sz,(float&)temp.z);
                    SkipSpaces(&sz);
                    curVertices.push_back(temp);

                    // Read the vertex normals
                    sz = fast_atoreal_move<float>(sz,(float&)temp.x);
                    SkipSpaces(&sz);

                    sz = fast_atoreal_move<float>(sz,(float&)temp.y);
                    SkipSpaces(&sz);

                    sz = fast_atoreal_move<float>(sz,(float&)temp.z);
                    SkipSpaces(&sz);
                    curNormals.push_back(temp);

                    // read the vertex colors
                    uint32_t clr = strtoul16(sz,&sz);
                    ColorFromARGBPacked(clr,c);

                    if (!curColors.empty() && c != *(curColors.end()-1))
                        useColors = true;

                    curColors.push_back(c);
                    SkipSpaces(&sz);


                    // read the first UV coordinate set
                    sz = fast_atoreal_move<float>(sz,(float&)temp.x);
                    SkipSpaces(&sz);

                    sz = fast_atoreal_move<float>(sz,(float&)temp.y);
                    SkipSpaces(&sz);
                    temp.z = 0.f;
                    temp.y = 1.f - temp.y;  // DX to OGL
                    curUVs.push_back(temp);

                    // read the (optional) second UV coordinate set
                    if (vertexFormat == 1)  {
                        sz = fast_atoreal_move<float>(sz,(float&)temp.x);
                        SkipSpaces(&sz);

                        sz = fast_atoreal_move<float>(sz,(float&)temp.y);
                        temp.y = 1.f - temp.y; // DX to OGL
                        curUV2s.push_back(temp);
                    }
                    // read optional tangent and bitangent vectors
                    else if (vertexFormat == 2) {
                        // tangents
                        sz = fast_atoreal_move<float>(sz,(float&)temp.x);
                        SkipSpaces(&sz);

                        sz = fast_atoreal_move<float>(sz,(float&)temp.z);
                        SkipSpaces(&sz);

                        sz = fast_atoreal_move<float>(sz,(float&)temp.y);
                        SkipSpaces(&sz);
                        temp.y *= -1.0f;
                        curTangents.push_back(temp);

                        // bitangents
                        sz = fast_atoreal_move<float>(sz,(float&)temp.x);
                        SkipSpaces(&sz);

                        sz = fast_atoreal_move<float>(sz,(float&)temp.z);
                        SkipSpaces(&sz);

                        sz = fast_atoreal_move<float>(sz,(float&)temp.y);
                        SkipSpaces(&sz);
                        temp.y *= -1.0f;
                        curBitangents.push_back(temp);
                    }
                }

                /* IMPORTANT: We assume that each vertex is specified in one
                   line. So we can skip the rest of the line - unknown vertex
                   elements are ignored.
                 */

                while (SkipLine(&sz));
            }
            else if (textMeaning == 2)  {
                textMeaning = 0;

                // read indices
                aiFace* curFace = curMesh->mFaces;
                aiFace* const faceEnd = curMesh->mFaces  + curMesh->mNumFaces;

                aiVector3D* pcV  = curMesh->mVertices;
                aiVector3D* pcN  = curMesh->mNormals;
                aiVector3D* pcT  = curMesh->mTangents;
                aiVector3D* pcB  = curMesh->mBitangents;
                aiColor4D* pcC0  = curMesh->mColors[0];
                aiVector3D* pcT0 = curMesh->mTextureCoords[0];
                aiVector3D* pcT1 = curMesh->mTextureCoords[1];

                unsigned int curIdx = 0;
                unsigned int total = 0;
                while(SkipSpacesAndLineEnd(&sz))    {
                    if (curFace >= faceEnd) {
                        ASSIMP_LOG_ERROR("IRRMESH: Too many indices");
                        break;
                    }
                    if (!curIdx)    {
                        curFace->mNumIndices = 3;
                        curFace->mIndices = new unsigned int[3];
                    }

                    unsigned int idx = strtoul10(sz,&sz);
                    if (idx >= curVertices.size())  {
                        ASSIMP_LOG_ERROR("IRRMESH: Index out of range");
                        idx = 0;
                    }

                    curFace->mIndices[curIdx] = total++;

                    *pcV++ = curVertices[idx];
                    if (pcN)*pcN++ = curNormals[idx];
                    if (pcT)*pcT++ = curTangents[idx];
                    if (pcB)*pcB++ = curBitangents[idx];
                    if (pcC0)*pcC0++ = curColors[idx];
                    if (pcT0)*pcT0++ = curUVs[idx];
                    if (pcT1)*pcT1++ = curUV2s[idx];

                    if (++curIdx == 3)  {
                        ++curFace;
                        curIdx = 0;
                    }
                }

                if (curFace != faceEnd)
                    ASSIMP_LOG_ERROR("IRRMESH: Not enough indices");

                // Finish processing the mesh - do some small material workarounds
                if (curMatFlags & AI_IRRMESH_MAT_trans_vertex_alpha && !useColors)  {
                    // Take the opacity value of the current material
                    // from the common vertex color alpha
                    aiMaterial* mat = (aiMaterial*)curMat;
                    mat->AddProperty(&curColors[0].a,1,AI_MATKEY_OPACITY);
                }
            }}
            break;

            default:
                // GCC complains here ...
                break;

        };
    }

    // End of the last buffer. A material and a mesh should be there
    if (curMat || curMesh)  {
        if ( !curMat || !curMesh)   {
            ASSIMP_LOG_ERROR("IRRMESH: A buffer must contain a mesh and a material");
            releaseMaterial( &curMat );
            releaseMesh( &curMesh );
        }
        else    {
            materials.push_back(curMat);
            meshes.push_back(curMesh);
        }
    }

    if (materials.empty())
        throw DeadlyImportError("IRRMESH: Unable to read a mesh from this file");


    // now generate the output scene
    pScene->mNumMeshes = (unsigned int)meshes.size();
    pScene->mMeshes = new aiMesh*[pScene->mNumMeshes];
    for (unsigned int i = 0; i < pScene->mNumMeshes;++i)    {
        pScene->mMeshes[i] = meshes[i];

        // clean this value ...
        pScene->mMeshes[i]->mNumUVComponents[3] = 0;
    }

    pScene->mNumMaterials = (unsigned int)materials.size();
    pScene->mMaterials = new aiMaterial*[pScene->mNumMaterials];
    ::memcpy(pScene->mMaterials,&materials[0],sizeof(void*)*pScene->mNumMaterials);

    pScene->mRootNode = new aiNode();
    pScene->mRootNode->mName.Set("<IRRMesh>");
    pScene->mRootNode->mNumMeshes = pScene->mNumMeshes;
    pScene->mRootNode->mMeshes = new unsigned int[pScene->mNumMeshes];

    for (unsigned int i = 0; i < pScene->mNumMeshes;++i)
        pScene->mRootNode->mMeshes[i] = i;

    // clean up and return
    delete reader;
    AI_DEBUG_INVALIDATE_PTR(reader);
}